

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.H
# Opt level: O1

void __thiscall amrex::BATransformer::set_index_type(BATransformer *this,IndexType typ)

{
  int iVar1;
  undefined8 uVar2;
  IntVect r;
  
  switch(this->m_bat_type) {
  case null:
    if (typ.itype == 0) {
      return;
    }
    this->m_bat_type = indexType;
    break;
  case indexType:
    if (typ.itype == 0) {
      this->m_bat_type = null;
      return;
    }
    break;
  case coarsenRatio:
    if (typ.itype == 0) {
      return;
    }
    this->m_bat_type = indexType_coarsenRatio;
    iVar1 = (this->m_op).m_bndryReg.m_crse_ratio.vect[0];
    uVar2 = *(undefined8 *)&this->m_op;
    (this->m_op).m_indexType.m_typ.itype = typ.itype;
    *(undefined8 *)((long)&this->m_op + 4) = uVar2;
    (this->m_op).m_bndryReg.m_crse_ratio.vect[1] = iVar1;
    return;
  case indexType_coarsenRatio:
    if (typ.itype == 0) {
      this->m_bat_type = coarsenRatio;
      *(undefined8 *)&this->m_op = *(undefined8 *)((long)&this->m_op + 4);
      (this->m_op).m_bndryReg.m_crse_ratio.vect[0] = (this->m_op).m_bndryReg.m_crse_ratio.vect[1];
      return;
    }
    break;
  default:
    (this->m_op).m_bndryReg.m_typ.itype = typ.itype;
    return;
  }
  (this->m_op).m_indexType.m_typ.itype = typ.itype;
  return;
}

Assistant:

void set_index_type (IndexType typ) noexcept {
        switch (m_bat_type)
        {
        case BATType::null:
        {
            if (typ.cellCentered()) {
                return;
            } else {
                m_bat_type = BATType::indexType;
                m_op.m_indexType.m_typ = typ;
                return;
            }
        }
        case BATType::indexType:
        {
            if (typ.cellCentered()) {
                m_bat_type = BATType::null;
                return;
            } else {
                m_op.m_indexType.m_typ = typ;
                return;
            }
        }
        case BATType::coarsenRatio:
        {
            if (typ.cellCentered()) {
                return;
            } else {
                m_bat_type = BATType::indexType_coarsenRatio;
                auto r = m_op.m_coarsenRatio.m_crse_ratio;
                m_op.m_indexType_coarsenRatio.m_typ = typ;
                m_op.m_indexType_coarsenRatio.m_crse_ratio = r;
                return;
            }
        }
        case BATType::indexType_coarsenRatio:
        {
            if (typ.cellCentered()) {
                m_bat_type = BATType::coarsenRatio;
                auto r = m_op.m_indexType_coarsenRatio.m_crse_ratio;
                m_op.m_coarsenRatio.m_crse_ratio = r;
                return;
            } else {
                m_op.m_indexType_coarsenRatio.m_typ = typ;
                return;
            }
        }
        default:
        {
            m_op.m_bndryReg.m_typ = typ;
            return;
        }
        }
    }